

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Node * StripSpan(TidyDocImpl *doc,Node *span)

{
  Node *pNVar1;
  Node *node;
  Node *element;
  
  prvTidyCleanWord2000(doc,span->content);
  pNVar1 = span->content;
  element = span->prev;
  node = pNVar1;
  if (span->prev == (Node *)0x0) {
    if (pNVar1 == (Node *)0x0) {
      element = (Node *)0x0;
      goto LAB_0014f166;
    }
    node = pNVar1->next;
    prvTidyRemoveNode(pNVar1);
    prvTidyInsertNodeBeforeElement(span,pNVar1);
    element = pNVar1;
  }
  while (node != (Node *)0x0) {
    pNVar1 = node->next;
    prvTidyRemoveNode(node);
    prvTidyInsertNodeAfterElement(element,node);
    element = node;
    node = pNVar1;
  }
LAB_0014f166:
  pNVar1 = span->next;
  if (pNVar1 == (Node *)0x0) {
    span->parent->last = element;
  }
  span->content = (Node *)0x0;
  prvTidyDiscardElement(doc,span);
  return pNVar1;
}

Assistant:

static Node* StripSpan( TidyDocImpl* doc, Node* span )
{
    Node *node, *prev = NULL, *content;

    /*
     deal with span elements that have content
     by splicing the content in place of the span
     after having processed it
    */

    TY_(CleanWord2000)( doc, span->content );
    content = span->content;

    if (span->prev)
        prev = span->prev;
    else if (content)
    {
        node = content;
        content = content->next;
        TY_(RemoveNode)(node);
        TY_(InsertNodeBeforeElement)(span, node);
        prev = node;
    }

    while (content)
    {
        node = content;
        content = content->next;
        TY_(RemoveNode)(node);
        TY_(InsertNodeAfterElement)(prev, node);
        prev = node;
    }

    if (span->next == NULL)
        span->parent->last = prev;

    node = span->next;
    span->content = NULL;
    TY_(DiscardElement)( doc, span );
    return node;
}